

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_3092e0::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader
          (JobEvalCacheMocT *this,SourceFileHandleT *headerHandle,string_view includerDir,
          string_view includeBase)

{
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  anon_class_16_2_3be181d0 findHeader;
  size_t local_90;
  char *pcStack_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_t local_70;
  char *pcStack_68;
  string local_60;
  anon_class_16_2_3be181d0 local_40;
  
  pcStack_88 = includeBase._M_str;
  local_90 = includeBase._M_len;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_JobEvalCacheT).SearchLocations,
                    (this->super_JobEvalCacheT).SearchLocations.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_70 = local_90;
  pcStack_68 = pcStack_88;
  views._M_len = 2;
  views._M_array = &local_80;
  local_80._M_len = includerDir._M_len;
  local_80._M_str = includerDir._M_str;
  local_40.this = this;
  local_40.headerHandle = headerHandle;
  cmCatViews_abi_cxx11_(&local_60,views);
  bVar3 = FindIncludedHeader::anon_class_16_2_3be181d0::operator()(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    return true;
  }
  pvVar1 = ((this->super_JobEvalCacheT).super_JobT.super_JobT.Pool_)->UserData_;
  __it._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)((long)pvVar1 + 0x380)
  ;
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)pvVar1 + 0x388);
  local_80._M_str = (char *)&local_90;
  lVar4 = (long)pbVar2 - (long)__it._M_current >> 7;
  local_80._M_len = (size_t)&local_40;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_80,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_001caaee;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_80,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_001caaee;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_80,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_001caaee;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_80,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_001caaee;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar2 - (long)__it._M_current >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pbVar2;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                                *)&local_80,__it), _Var5._M_current = __it._M_current, bVar3))
      goto LAB_001caaee;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_80,__it);
    _Var5._M_current = __it._M_current;
    if (bVar3) goto LAB_001caaee;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)&local_80,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar3) {
    _Var5._M_current = pbVar2;
  }
LAB_001caaee:
  return _Var5._M_current != pbVar2;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(
  SourceFileHandleT& headerHandle, cm::string_view includerDir,
  cm::string_view includeBase)
{
  // Clear search locations
  this->SearchLocations.clear();

  auto findHeader = [this,
                     &headerHandle](std::string const& basePath) -> bool {
    bool found = false;
    for (std::string const& ext : this->BaseConst().HeaderExtensions) {
      std::string const testPath =
        this->Gen()->CollapseFullPathTS(cmStrCat(basePath, '.', ext));
      cmFileTime fileTime;
      if (!fileTime.Load(testPath)) {
        // File not found
        continue;
      }

      // Return a known file if it exists already
      {
        auto it = this->BaseEval().Headers.find(testPath);
        if (it != this->BaseEval().Headers.end()) {
          headerHandle = it->second;
          found = true;
          break;
        }
      }

      // Created and return discovered file entry
      {
        SourceFileHandleT& handle =
          this->MocEval().HeadersDiscovered[testPath];
        if (!handle) {
          handle = std::make_shared<SourceFileT>(testPath);
          handle->FileTime = fileTime;
          handle->IsHeader = true;
          handle->Moc = true;
        }
        headerHandle = handle;
        found = true;
        break;
      }
    }
    if (!found) {
      this->SearchLocations.emplace_back(cmQtAutoGen::ParentDir(basePath));
    }
    return found;
  };

  // Search in vicinity of the source
  if (findHeader(cmStrCat(includerDir, includeBase))) {
    return true;
  }
  // Search in include directories
  auto const& includePaths = this->MocConst().IncludePaths;
  return std::any_of(
    includePaths.begin(), includePaths.end(),
    [&findHeader, &includeBase](std::string const& path) -> bool {
      return findHeader(cmStrCat(path, '/', includeBase));
    });
}